

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O0

bool __thiscall MockSupport::hasCallsOutOfOrder(MockSupport *this)

{
  bool bVar1;
  MockSupport *pMVar2;
  MockNamedValueListNode *local_20;
  MockNamedValueListNode *p;
  MockSupport *this_local;
  
  bVar1 = MockExpectedCallsList::hasCallsOutOfOrder(&this->expectations_);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    for (local_20 = MockNamedValueList::begin(&this->data_);
        local_20 != (MockNamedValueListNode *)0x0; local_20 = MockNamedValueListNode::next(local_20)
        ) {
      pMVar2 = getMockSupport(this,local_20);
      if (pMVar2 != (MockSupport *)0x0) {
        pMVar2 = getMockSupport(this,local_20);
        bVar1 = hasCallsOutOfOrder(pMVar2);
        if (bVar1) {
          return true;
        }
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MockSupport::hasCallsOutOfOrder()
{
    if (expectations_.hasCallsOutOfOrder())
    {
        return true;
    }
    for (MockNamedValueListNode* p = data_.begin(); p; p = p->next())
        if (getMockSupport(p) && getMockSupport(p)->hasCallsOutOfOrder())
        {
            return true;
        }
    return false;
}